

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O3

uint mraa_get_platform_adc_supported_bits(int platform_offset)

{
  uint uVar1;
  mraa_board_t *pmVar2;
  
  uVar1 = 0;
  pmVar2 = plat;
  if (platform_offset != 0) {
    if (plat == (mraa_board_t *)0x0) {
      return 0;
    }
    pmVar2 = plat->sub_platform;
  }
  if ((pmVar2 != (mraa_board_t *)0x0) && (pmVar2->aio_count != 0)) {
    uVar1 = pmVar2->adc_supported;
  }
  return uVar1;
}

Assistant:

unsigned int
mraa_get_platform_adc_supported_bits(int platform_offset)
{
    if (platform_offset == MRAA_MAIN_PLATFORM_OFFSET)
        return mraa_adc_supported_bits();
    else {
        if (!mraa_has_sub_platform())
            return 0;

        if (plat->sub_platform->aio_count == 0)
            return 0;

        return plat->sub_platform->adc_supported;
    }
}